

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::
    make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
              (_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args,types *args_1
              )

{
  holder<cs::callable> *args_2;
  proxy *dat;
  int *in_RDX;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  proxy *in_RDI;
  proxy *ppVar1;
  _func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar3 = 1;
  uVar2 = 1;
  ppVar1 = in_RDI;
  args_2 = cs::
           allocator_type<cs_impl::any::holder<cs::callable>,64ul,cs_impl::default_allocator_provider>
           ::
           alloc<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
                     ((allocator_type<cs_impl::any::holder<cs::callable>,_64UL,_cs_impl::default_allocator_provider>
                       *)0x100000001,in_stack_ffffffffffffffd8,(types *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::callable>*>
                  (in_RSI,in_RDX,(int *)CONCAT44(uVar3,uVar2),(holder<cs::callable> **)args_2);
  any((any *)in_RDI,dat);
  return (any)ppVar1;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}